

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RunLoop.cpp
# Opt level: O0

Closure * __thiscall loop::RunLoop::quit_closure(Closure *__return_storage_ptr__,RunLoop *this)

{
  RunLoop *local_48;
  code *local_40;
  undefined8 local_38;
  type local_30;
  RunLoop *local_18;
  RunLoop *this_local;
  
  local_40 = quit;
  local_38 = 0;
  local_48 = this;
  local_18 = this;
  this_local = (RunLoop *)__return_storage_ptr__;
  std::bind<void(loop::RunLoop::*)(),loop::RunLoop*>
            (&local_30,(offset_in_RunLoop_to_subr *)&local_40,&local_48);
  std::function<void()>::function<std::_Bind<void(loop::RunLoop::*(loop::RunLoop*))()>,void>
            ((function<void()> *)__return_storage_ptr__,&local_30);
  return __return_storage_ptr__;
}

Assistant:

Closure RunLoop::quit_closure()
{
    return std::bind(&RunLoop::quit, this);
}